

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error epilogProcessor(XML_Parser parser,char *s,char *end,char **nextPtr)

{
  XML_Parsing XVar1;
  bool bVar2;
  int iVar3;
  XML_Error unaff_EBP;
  char *next;
  char *local_38;
  
  parser->m_processor = epilogProcessor;
  parser->m_eventPtr = s;
  do {
    local_38 = (char *)0x0;
    iVar3 = (*parser->m_encoding->scanners[0])(parser->m_encoding,s,end,&local_38);
    parser->m_eventEndPtr = local_38;
    bVar2 = false;
    if (10 < iVar3) {
      if (iVar3 == 0xb) {
        iVar3 = reportProcessingInstruction(parser,parser->m_encoding,s,local_38);
LAB_005fb17b:
        if (iVar3 == 0) {
          unaff_EBP = XML_ERROR_NO_MEMORY;
          goto LAB_005fb1be;
        }
      }
      else {
        if (iVar3 == 0xd) {
          iVar3 = reportComment(parser,parser->m_encoding,s,local_38);
          goto LAB_005fb17b;
        }
        if (iVar3 != 0xf) goto switchD_005fb094_caseD_fffffffd;
        if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
          reportDefault(parser,parser->m_encoding,s,local_38);
        }
      }
      parser->m_eventPtr = local_38;
      XVar1 = (parser->m_parsingStatus).parsing;
      s = local_38;
      if (XVar1 == XML_FINISHED) {
LAB_005fb1a8:
        unaff_EBP = XML_ERROR_ABORTED;
        goto LAB_005fb1be;
      }
      if (XVar1 == XML_SUSPENDED) goto switchD_005fb094_caseD_fffffffc;
      bVar2 = true;
      goto LAB_005fb1c0;
    }
    switch(iVar3) {
    case 0:
      parser->m_eventPtr = local_38;
      unaff_EBP = XML_ERROR_INVALID_TOKEN;
      break;
    case -4:
switchD_005fb094_caseD_fffffffc:
      *nextPtr = s;
      goto LAB_005fb1a4;
    case -3:
switchD_005fb094_caseD_fffffffd:
      unaff_EBP = XML_ERROR_JUNK_AFTER_DOC_ELEMENT;
      local_38 = s;
      goto LAB_005fb1c0;
    case -2:
      if ((parser->m_parsingStatus).finalBuffer == '\0') {
LAB_005fb1af:
        unaff_EBP = XML_ERROR_NONE;
        *nextPtr = s;
      }
      else {
        unaff_EBP = XML_ERROR_PARTIAL_CHAR;
      }
      break;
    case -1:
      if ((parser->m_parsingStatus).finalBuffer == '\0') goto LAB_005fb1af;
      unaff_EBP = XML_ERROR_UNCLOSED_TOKEN;
      break;
    default:
      if (iVar3 != -0xf) goto switchD_005fb094_caseD_fffffffd;
      if ((parser->m_defaultHandler != (XML_DefaultHandler)0x0) &&
         (reportDefault(parser,parser->m_encoding,s,local_38),
         (parser->m_parsingStatus).parsing == XML_FINISHED)) goto LAB_005fb1a8;
      *nextPtr = local_38;
LAB_005fb1a4:
      unaff_EBP = XML_ERROR_NONE;
    }
LAB_005fb1be:
    bVar2 = false;
    local_38 = s;
LAB_005fb1c0:
    s = local_38;
    if (!bVar2) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

static enum XML_Error PTRCALL
epilogProcessor(XML_Parser parser, const char *s, const char *end,
                const char **nextPtr) {
  parser->m_processor = epilogProcessor;
  parser->m_eventPtr = s;
  for (;;) {
    const char *next = NULL;
    int tok = XmlPrologTok(parser->m_encoding, s, end, &next);
#ifdef XML_DTD
    if (! accountingDiffTolerated(parser, tok, s, next, __LINE__,
                                  XML_ACCOUNT_DIRECT)) {
      accountingOnAbort(parser);
      return XML_ERROR_AMPLIFICATION_LIMIT_BREACH;
    }
#endif
    parser->m_eventEndPtr = next;
    switch (tok) {
    /* report partial linebreak - it might be the last token */
    case -XML_TOK_PROLOG_S:
      if (parser->m_defaultHandler) {
        reportDefault(parser, parser->m_encoding, s, next);
        if (parser->m_parsingStatus.parsing == XML_FINISHED)
          return XML_ERROR_ABORTED;
      }
      *nextPtr = next;
      return XML_ERROR_NONE;
    case XML_TOK_NONE:
      *nextPtr = s;
      return XML_ERROR_NONE;
    case XML_TOK_PROLOG_S:
      if (parser->m_defaultHandler)
        reportDefault(parser, parser->m_encoding, s, next);
      break;
    case XML_TOK_PI:
      if (! reportProcessingInstruction(parser, parser->m_encoding, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_COMMENT:
      if (! reportComment(parser, parser->m_encoding, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_INVALID:
      parser->m_eventPtr = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL:
      if (! parser->m_parsingStatus.finalBuffer) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_TOKEN;
    case XML_TOK_PARTIAL_CHAR:
      if (! parser->m_parsingStatus.finalBuffer) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    default:
      return XML_ERROR_JUNK_AFTER_DOC_ELEMENT;
    }
    parser->m_eventPtr = s = next;
    switch (parser->m_parsingStatus.parsing) {
    case XML_SUSPENDED:
      *nextPtr = next;
      return XML_ERROR_NONE;
    case XML_FINISHED:
      return XML_ERROR_ABORTED;
    default:;
    }
  }
}